

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O1

void __thiscall
icu_63::ChineseCalendar::add
          (ChineseCalendar *this,UCalendarDateFields field,int32_t amount,UErrorCode *status)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar1;
  int32_t iVar2;
  
  if (field != UCAL_MONTH) {
    Calendar::add(&this->super_Calendar,field,amount,status);
    return;
  }
  if (amount != 0) {
    uVar1 = Calendar::get(&this->super_Calendar,UCAL_DATE,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar2 = Calendar::get(&this->super_Calendar,UCAL_JULIAN_DAY,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        UNRECOVERED_JUMPTABLE = (this->super_Calendar).super_UObject._vptr_UObject[0x3a];
        (*UNRECOVERED_JUMPTABLE)
                  (this,(ulong)((iVar2 - uVar1) - 0x253d8b),(ulong)uVar1,(ulong)(uint)amount,
                   UNRECOVERED_JUMPTABLE);
        return;
      }
    }
  }
  return;
}

Assistant:

void ChineseCalendar::add(UCalendarDateFields field, int32_t amount, UErrorCode& status) {
    switch (field) {
    case UCAL_MONTH:
        if (amount != 0) {
            int32_t dom = get(UCAL_DAY_OF_MONTH, status);
            if (U_FAILURE(status)) break;
            int32_t day = get(UCAL_JULIAN_DAY, status) - kEpochStartAsJulianDay; // Get local day
            if (U_FAILURE(status)) break;
            int32_t moon = day - dom + 1; // New moon 
            offsetMonth(moon, dom, amount);
        }
        break;
    default:
        Calendar::add(field, amount, status);
        break;
    }
}